

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

void __thiscall
kj::Array<const_kj::ReadableDirectory_*>::~Array(Array<const_kj::ReadableDirectory_*> *this)

{
  ReadableDirectory **ppRVar1;
  size_t sVar2;
  
  ppRVar1 = this->ptr;
  if (ppRVar1 != (ReadableDirectory **)0x0) {
    sVar2 = this->size_;
    this->ptr = (ReadableDirectory **)0x0;
    this->size_ = 0;
    (**this->disposer->_vptr_ArrayDisposer)(this->disposer,ppRVar1,8,sVar2,sVar2,0);
  }
  return;
}

Assistant:

inline ~Array() noexcept { dispose(); }